

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNValidatorLoop(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ostream *poVar3;
  Result local_c8;
  InnerProductLayerParams *innerProductParams3;
  NeuralNetworkLayer *ip3;
  InnerProductLayerParams *innerProductParams2;
  NeuralNetworkLayer *ip2;
  InnerProductLayerParams *innerProductParams1;
  NeuralNetworkLayer *ip1;
  NeuralNetwork *nn;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  ip1 = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  innerProductParams1 =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)ip1);
  ip2 = (NeuralNetworkLayer *)
        CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                  ((NeuralNetworkLayer *)innerProductParams1);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)innerProductParams1,"ip1");
  CoreML::Specification::InnerProductLayerParams::set_hasbias((InnerProductLayerParams *)ip2,false);
  innerProductParams2 =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)ip1);
  ip3 = (NeuralNetworkLayer *)
        CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                  ((NeuralNetworkLayer *)innerProductParams2);
  CoreML::Specification::InnerProductLayerParams::set_hasbias((InnerProductLayerParams *)ip3,false);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)innerProductParams2,"ip2");
  innerProductParams3 =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)ip1);
  local_c8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)innerProductParams3);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)local_c8.m_message._M_storage._M_storage,false);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)innerProductParams3,"ip3");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams1,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams1,"B");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams2,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams2,"C");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams3,"C");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams3,"A");
  CoreML::validate<(MLModelType)500>(&local_c8,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_c8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x229);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_c8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNValidatorLoop() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *ip1 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams1 = ip1->mutable_innerproduct();
    ip1->set_name("ip1");

    innerProductParams1->set_hasbias(false);

    Specification::NeuralNetworkLayer *ip2 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams2 = ip2->mutable_innerproduct();

    innerProductParams2->set_hasbias(false);

    ip2->set_name("ip2");

    Specification::NeuralNetworkLayer *ip3 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams3 = ip3->mutable_innerproduct();

    innerProductParams3->set_hasbias(false);
    ip3->set_name("ip3");

    // Make a loop

    ip1->add_input("A");
    ip1->add_output("B");

    ip2->add_input("B");
    ip2->add_output("C");

    ip3->add_input("C");
    ip3->add_output("A");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}